

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ec_pubkey_parse
              (secp256k1_context *ctx,secp256k1_pubkey *pubkey,uchar *input,size_t inputlen)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  int iVar151;
  ulong uVar152;
  ulong uVar153;
  ulong uVar154;
  ulong uVar155;
  ulong uVar156;
  ulong uVar157;
  ulong uVar158;
  ulong uVar159;
  ulong uVar160;
  ulong uVar161;
  uint64_t tmp3;
  uint64_t tmp3_1;
  secp256k1_fe x;
  secp256k1_fe x_1;
  secp256k1_ge Q;
  uint64_t tmp2;
  secp256k1_fe y2;
  secp256k1_fe local_150;
  secp256k1_fe local_128;
  secp256k1_fe local_100;
  secp256k1_ge local_d8;
  long local_80;
  ulong local_78;
  ulong uStack_70;
  ulong local_68;
  long lStack_60;
  ulong local_58;
  ulong local_50;
  ulong uStack_48;
  ulong local_40;
  long lStack_38;
  
  if (pubkey == (secp256k1_pubkey *)0x0) {
    secp256k1_ec_pubkey_parse_cold_2();
  }
  else {
    pubkey->data[0x30] = '\0';
    pubkey->data[0x31] = '\0';
    pubkey->data[0x32] = '\0';
    pubkey->data[0x33] = '\0';
    pubkey->data[0x34] = '\0';
    pubkey->data[0x35] = '\0';
    pubkey->data[0x36] = '\0';
    pubkey->data[0x37] = '\0';
    pubkey->data[0x38] = '\0';
    pubkey->data[0x39] = '\0';
    pubkey->data[0x3a] = '\0';
    pubkey->data[0x3b] = '\0';
    pubkey->data[0x3c] = '\0';
    pubkey->data[0x3d] = '\0';
    pubkey->data[0x3e] = '\0';
    pubkey->data[0x3f] = '\0';
    pubkey->data[0x20] = '\0';
    pubkey->data[0x21] = '\0';
    pubkey->data[0x22] = '\0';
    pubkey->data[0x23] = '\0';
    pubkey->data[0x24] = '\0';
    pubkey->data[0x25] = '\0';
    pubkey->data[0x26] = '\0';
    pubkey->data[0x27] = '\0';
    pubkey->data[0x28] = '\0';
    pubkey->data[0x29] = '\0';
    pubkey->data[0x2a] = '\0';
    pubkey->data[0x2b] = '\0';
    pubkey->data[0x2c] = '\0';
    pubkey->data[0x2d] = '\0';
    pubkey->data[0x2e] = '\0';
    pubkey->data[0x2f] = '\0';
    pubkey->data[0x10] = '\0';
    pubkey->data[0x11] = '\0';
    pubkey->data[0x12] = '\0';
    pubkey->data[0x13] = '\0';
    pubkey->data[0x14] = '\0';
    pubkey->data[0x15] = '\0';
    pubkey->data[0x16] = '\0';
    pubkey->data[0x17] = '\0';
    pubkey->data[0x18] = '\0';
    pubkey->data[0x19] = '\0';
    pubkey->data[0x1a] = '\0';
    pubkey->data[0x1b] = '\0';
    pubkey->data[0x1c] = '\0';
    pubkey->data[0x1d] = '\0';
    pubkey->data[0x1e] = '\0';
    pubkey->data[0x1f] = '\0';
    pubkey->data[0] = '\0';
    pubkey->data[1] = '\0';
    pubkey->data[2] = '\0';
    pubkey->data[3] = '\0';
    pubkey->data[4] = '\0';
    pubkey->data[5] = '\0';
    pubkey->data[6] = '\0';
    pubkey->data[7] = '\0';
    pubkey->data[8] = '\0';
    pubkey->data[9] = '\0';
    pubkey->data[10] = '\0';
    pubkey->data[0xb] = '\0';
    pubkey->data[0xc] = '\0';
    pubkey->data[0xd] = '\0';
    pubkey->data[0xe] = '\0';
    pubkey->data[0xf] = '\0';
    if (input == (uchar *)0x0) {
      secp256k1_ec_pubkey_parse_cold_1();
    }
    else {
      iVar151 = 0;
      if (inputlen == 0x41) {
        bVar1 = *input;
        if ((bVar1 < 8) && ((0xd0U >> (bVar1 & 0x1f) & 1) != 0)) {
          secp256k1_fe_impl_set_b32_mod(&local_100,input + 1);
          iVar151 = 0;
          if ((((local_100.n[0] < 0xffffefffffc2f) ||
               ((local_100.n[4] != 0xffffffffffff ||
                ((local_100.n[2] & local_100.n[3] & local_100.n[1]) != 0xfffffffffffff)))) &&
              ((secp256k1_fe_impl_set_b32_mod(&local_128,input + 0x21),
               local_128.n[0] < 0xffffefffffc2f ||
               ((local_128.n[4] != 0xffffffffffff ||
                ((local_128.n[2] & local_128.n[3] & local_128.n[1]) != 0xfffffffffffff)))))) &&
             (local_d8.infinity = 0,
             ((bVar1 & 0xfe) == 6 & (bVar1 != 7 ^ (byte)local_128.n[0] ^ 1)) == 0)) {
            auVar2._8_8_ = 0;
            auVar2._0_8_ = local_128.n[0] * 2;
            auVar72._8_8_ = 0;
            auVar72._0_8_ = local_128.n[3];
            auVar3._8_8_ = 0;
            auVar3._0_8_ = local_128.n[1] * 2;
            auVar73._8_8_ = 0;
            auVar73._0_8_ = local_128.n[2];
            auVar4._8_8_ = 0;
            auVar4._0_8_ = local_128.n[4];
            auVar74._8_8_ = 0;
            auVar74._0_8_ = local_128.n[4];
            uVar152 = SUB168(auVar4 * auVar74,0);
            auVar5._8_8_ = 0;
            auVar5._0_8_ = uVar152 & 0xfffffffffffff;
            auVar2 = auVar3 * auVar73 + auVar2 * auVar72 + auVar5 * ZEXT816(0x1000003d10);
            uVar153 = auVar2._0_8_;
            auVar130._8_8_ = 0;
            auVar130._0_8_ = uVar153 >> 0x34 | auVar2._8_8_ << 0xc;
            uVar155 = local_128.n[4] * 2;
            auVar6._8_8_ = 0;
            auVar6._0_8_ = local_128.n[0];
            auVar75._8_8_ = 0;
            auVar75._0_8_ = uVar155;
            auVar7._8_8_ = 0;
            auVar7._0_8_ = local_128.n[1] * 2;
            auVar76._8_8_ = 0;
            auVar76._0_8_ = local_128.n[3];
            auVar8._8_8_ = 0;
            auVar8._0_8_ = local_128.n[2];
            auVar77._8_8_ = 0;
            auVar77._0_8_ = local_128.n[2];
            auVar9._8_8_ = 0;
            auVar9._0_8_ = uVar152 >> 0x34 | SUB168(auVar4 * auVar74,8) << 0xc;
            auVar2 = auVar6 * auVar75 + auVar130 + auVar7 * auVar76 + auVar8 * auVar77 +
                     auVar9 * ZEXT816(0x1000003d10);
            uVar152 = auVar2._0_8_;
            auVar131._8_8_ = 0;
            auVar131._0_8_ = uVar152 >> 0x34 | auVar2._8_8_ << 0xc;
            auVar10._8_8_ = 0;
            auVar10._0_8_ = local_128.n[0];
            auVar78._8_8_ = 0;
            auVar78._0_8_ = local_128.n[0];
            auVar11._8_8_ = 0;
            auVar11._0_8_ = local_128.n[1];
            auVar79._8_8_ = 0;
            auVar79._0_8_ = uVar155;
            auVar12._8_8_ = 0;
            auVar12._0_8_ = local_128.n[2] * 2;
            auVar80._8_8_ = 0;
            auVar80._0_8_ = local_128.n[3];
            auVar2 = auVar11 * auVar79 + auVar131 + auVar12 * auVar80;
            uVar154 = auVar2._0_8_;
            auVar133._8_8_ = 0;
            auVar133._0_8_ = uVar154 >> 0x34 | auVar2._8_8_ << 0xc;
            auVar81._8_8_ = 0;
            auVar81._0_8_ = (uVar154 & 0xfffffffffffff) << 4 | (uVar152 & 0xfffffffffffff) >> 0x30;
            auVar2 = auVar10 * auVar78 + ZEXT816(0x1000003d1) * auVar81;
            uVar154 = auVar2._0_8_;
            local_58 = uVar154 & 0xfffffffffffff;
            auVar132._8_8_ = 0;
            auVar132._0_8_ = uVar154 >> 0x34 | auVar2._8_8_ << 0xc;
            auVar13._8_8_ = 0;
            auVar13._0_8_ = local_128.n[0] * 2;
            auVar82._8_8_ = 0;
            auVar82._0_8_ = local_128.n[1];
            auVar14._8_8_ = 0;
            auVar14._0_8_ = local_128.n[2];
            auVar83._8_8_ = 0;
            auVar83._0_8_ = uVar155;
            auVar15._8_8_ = 0;
            auVar15._0_8_ = local_128.n[3];
            auVar84._8_8_ = 0;
            auVar84._0_8_ = local_128.n[3];
            auVar3 = auVar14 * auVar83 + auVar133 + auVar15 * auVar84;
            uVar154 = auVar3._0_8_;
            auVar16._8_8_ = 0;
            auVar16._0_8_ = uVar154 & 0xfffffffffffff;
            auVar2 = auVar13 * auVar82 + auVar132 + auVar16 * ZEXT816(0x1000003d10);
            uVar156 = auVar2._0_8_;
            auVar135._8_8_ = 0;
            auVar135._0_8_ = uVar154 >> 0x34 | auVar3._8_8_ << 0xc;
            local_50 = uVar156 & 0xfffffffffffff;
            auVar134._8_8_ = 0;
            auVar134._0_8_ = uVar156 >> 0x34 | auVar2._8_8_ << 0xc;
            auVar17._8_8_ = 0;
            auVar17._0_8_ = local_128.n[0] * 2;
            auVar85._8_8_ = 0;
            auVar85._0_8_ = local_128.n[2];
            auVar18._8_8_ = 0;
            auVar18._0_8_ = local_128.n[1];
            auVar86._8_8_ = 0;
            auVar86._0_8_ = local_128.n[1];
            auVar19._8_8_ = 0;
            auVar19._0_8_ = local_128.n[3];
            auVar87._8_8_ = 0;
            auVar87._0_8_ = uVar155;
            auVar135 = auVar19 * auVar87 + auVar135;
            uVar155 = auVar135._0_8_;
            auVar20._8_8_ = 0;
            auVar20._0_8_ = uVar155 & 0xfffffffffffff;
            auVar2 = auVar17 * auVar85 + auVar134 + auVar18 * auVar86 +
                     auVar20 * ZEXT816(0x1000003d10);
            uVar154 = auVar2._0_8_;
            uStack_48 = uVar154 & 0xfffffffffffff;
            auVar136._8_8_ = 0;
            auVar136._0_8_ = (uVar154 >> 0x34 | auVar2._8_8_ << 0xc) + (uVar153 & 0xfffffffffffff);
            auVar21._8_8_ = 0;
            auVar21._0_8_ = uVar155 >> 0x34 | auVar135._8_8_ << 0xc;
            auVar136 = auVar21 * ZEXT816(0x1000003d10) + auVar136;
            uVar155 = auVar136._0_8_;
            local_40 = uVar155 & 0xfffffffffffff;
            lStack_38 = (uVar155 >> 0x34 | auVar136._8_8_ << 0xc) + (uVar152 & 0xffffffffffff);
            auVar22._8_8_ = 0;
            auVar22._0_8_ = local_100.n[0] * 2;
            auVar88._8_8_ = 0;
            auVar88._0_8_ = local_100.n[3];
            auVar23._8_8_ = 0;
            auVar23._0_8_ = local_100.n[1] * 2;
            auVar89._8_8_ = 0;
            auVar89._0_8_ = local_100.n[2];
            auVar24._8_8_ = 0;
            auVar24._0_8_ = local_100.n[4];
            auVar90._8_8_ = 0;
            auVar90._0_8_ = local_100.n[4];
            uVar152 = SUB168(auVar24 * auVar90,0);
            auVar25._8_8_ = 0;
            auVar25._0_8_ = uVar152 & 0xfffffffffffff;
            auVar2 = auVar23 * auVar89 + auVar22 * auVar88 + auVar25 * ZEXT816(0x1000003d10);
            uVar154 = auVar2._0_8_;
            auVar137._8_8_ = 0;
            auVar137._0_8_ = uVar154 >> 0x34 | auVar2._8_8_ << 0xc;
            uVar155 = local_100.n[4] * 2;
            auVar26._8_8_ = 0;
            auVar26._0_8_ = local_100.n[0];
            auVar91._8_8_ = 0;
            auVar91._0_8_ = uVar155;
            auVar27._8_8_ = 0;
            auVar27._0_8_ = local_100.n[1] * 2;
            auVar92._8_8_ = 0;
            auVar92._0_8_ = local_100.n[3];
            auVar28._8_8_ = 0;
            auVar28._0_8_ = local_100.n[2];
            auVar93._8_8_ = 0;
            auVar93._0_8_ = local_100.n[2];
            auVar29._8_8_ = 0;
            auVar29._0_8_ = uVar152 >> 0x34 | SUB168(auVar24 * auVar90,8) << 0xc;
            auVar2 = auVar26 * auVar91 + auVar137 + auVar27 * auVar92 + auVar28 * auVar93 +
                     auVar29 * ZEXT816(0x1000003d10);
            uVar156 = auVar2._0_8_;
            auVar138._8_8_ = 0;
            auVar138._0_8_ = uVar156 >> 0x34 | auVar2._8_8_ << 0xc;
            auVar30._8_8_ = 0;
            auVar30._0_8_ = local_100.n[0];
            auVar94._8_8_ = 0;
            auVar94._0_8_ = local_100.n[0];
            auVar31._8_8_ = 0;
            auVar31._0_8_ = local_100.n[1];
            auVar95._8_8_ = 0;
            auVar95._0_8_ = uVar155;
            auVar32._8_8_ = 0;
            auVar32._0_8_ = local_100.n[2] * 2;
            auVar96._8_8_ = 0;
            auVar96._0_8_ = local_100.n[3];
            auVar2 = auVar31 * auVar95 + auVar138 + auVar32 * auVar96;
            uVar152 = auVar2._0_8_;
            auVar140._8_8_ = 0;
            auVar140._0_8_ = uVar152 >> 0x34 | auVar2._8_8_ << 0xc;
            auVar97._8_8_ = 0;
            auVar97._0_8_ = (uVar152 & 0xfffffffffffff) << 4 | (uVar156 & 0xfffffffffffff) >> 0x30;
            auVar2 = auVar30 * auVar94 + ZEXT816(0x1000003d1) * auVar97;
            uVar153 = auVar2._0_8_;
            uVar152 = uVar153 & 0xfffffffffffff;
            auVar139._8_8_ = 0;
            auVar139._0_8_ = uVar153 >> 0x34 | auVar2._8_8_ << 0xc;
            auVar33._8_8_ = 0;
            auVar33._0_8_ = local_100.n[0] * 2;
            auVar98._8_8_ = 0;
            auVar98._0_8_ = local_100.n[1];
            auVar34._8_8_ = 0;
            auVar34._0_8_ = local_100.n[2];
            auVar99._8_8_ = 0;
            auVar99._0_8_ = uVar155;
            auVar35._8_8_ = 0;
            auVar35._0_8_ = local_100.n[3];
            auVar100._8_8_ = 0;
            auVar100._0_8_ = local_100.n[3];
            auVar3 = auVar34 * auVar99 + auVar140 + auVar35 * auVar100;
            uVar153 = auVar3._0_8_;
            auVar36._8_8_ = 0;
            auVar36._0_8_ = uVar153 & 0xfffffffffffff;
            auVar2 = auVar33 * auVar98 + auVar139 + auVar36 * ZEXT816(0x1000003d10);
            uVar157 = auVar2._0_8_;
            auVar142._8_8_ = 0;
            auVar142._0_8_ = uVar153 >> 0x34 | auVar3._8_8_ << 0xc;
            uVar153 = uVar157 & 0xfffffffffffff;
            auVar141._8_8_ = 0;
            auVar141._0_8_ = uVar157 >> 0x34 | auVar2._8_8_ << 0xc;
            auVar37._8_8_ = 0;
            auVar37._0_8_ = local_100.n[0] * 2;
            auVar101._8_8_ = 0;
            auVar101._0_8_ = local_100.n[2];
            auVar38._8_8_ = 0;
            auVar38._0_8_ = local_100.n[1];
            auVar102._8_8_ = 0;
            auVar102._0_8_ = local_100.n[1];
            auVar39._8_8_ = 0;
            auVar39._0_8_ = local_100.n[3];
            auVar103._8_8_ = 0;
            auVar103._0_8_ = uVar155;
            auVar142 = auVar39 * auVar103 + auVar142;
            uVar157 = auVar142._0_8_;
            auVar40._8_8_ = 0;
            auVar40._0_8_ = uVar157 & 0xfffffffffffff;
            auVar2 = auVar37 * auVar101 + auVar141 + auVar38 * auVar102 +
                     auVar40 * ZEXT816(0x1000003d10);
            uVar158 = auVar2._0_8_;
            uVar155 = uVar158 & 0xfffffffffffff;
            auVar143._8_8_ = 0;
            auVar143._0_8_ = (uVar158 >> 0x34 | auVar2._8_8_ << 0xc) + (uVar154 & 0xfffffffffffff);
            auVar41._8_8_ = 0;
            auVar41._0_8_ = uVar157 >> 0x34 | auVar142._8_8_ << 0xc;
            auVar143 = auVar41 * ZEXT816(0x1000003d10) + auVar143;
            uVar157 = auVar143._0_8_;
            uVar154 = uVar157 & 0xfffffffffffff;
            uVar159 = (uVar157 >> 0x34 | auVar143._8_8_ << 0xc) + (uVar156 & 0xffffffffffff);
            auVar42._8_8_ = 0;
            auVar42._0_8_ = local_100.n[0];
            auVar104._8_8_ = 0;
            auVar104._0_8_ = uVar154;
            auVar43._8_8_ = 0;
            auVar43._0_8_ = local_100.n[1];
            auVar105._8_8_ = 0;
            auVar105._0_8_ = uVar155;
            auVar44._8_8_ = 0;
            auVar44._0_8_ = local_100.n[2];
            auVar106._8_8_ = 0;
            auVar106._0_8_ = uVar153;
            auVar45._8_8_ = 0;
            auVar45._0_8_ = local_100.n[3];
            auVar107._8_8_ = 0;
            auVar107._0_8_ = uVar152;
            auVar46._8_8_ = 0;
            auVar46._0_8_ = local_100.n[4];
            auVar108._8_8_ = 0;
            auVar108._0_8_ = uVar159;
            uVar156 = SUB168(auVar46 * auVar108,0);
            auVar47._8_8_ = 0;
            auVar47._0_8_ = uVar156 & 0xfffffffffffff;
            auVar2 = auVar43 * auVar105 + auVar42 * auVar104 + auVar44 * auVar106 +
                     auVar45 * auVar107 + auVar47 * ZEXT816(0x1000003d10);
            uVar157 = auVar2._0_8_;
            auVar144._8_8_ = 0;
            auVar144._0_8_ = uVar157 >> 0x34 | auVar2._8_8_ << 0xc;
            auVar48._8_8_ = 0;
            auVar48._0_8_ = local_100.n[0];
            auVar109._8_8_ = 0;
            auVar109._0_8_ = uVar159;
            auVar49._8_8_ = 0;
            auVar49._0_8_ = local_100.n[1];
            auVar110._8_8_ = 0;
            auVar110._0_8_ = uVar154;
            auVar50._8_8_ = 0;
            auVar50._0_8_ = local_100.n[2];
            auVar111._8_8_ = 0;
            auVar111._0_8_ = uVar155;
            auVar51._8_8_ = 0;
            auVar51._0_8_ = local_100.n[3];
            auVar112._8_8_ = 0;
            auVar112._0_8_ = uVar153;
            auVar52._8_8_ = 0;
            auVar52._0_8_ = local_100.n[4];
            auVar113._8_8_ = 0;
            auVar113._0_8_ = uVar152;
            auVar53._8_8_ = 0;
            auVar53._0_8_ = uVar156 >> 0x34 | SUB168(auVar46 * auVar108,8) << 0xc;
            auVar2 = auVar48 * auVar109 + auVar144 + auVar49 * auVar110 + auVar50 * auVar111 +
                     auVar51 * auVar112 + auVar52 * auVar113 + auVar53 * ZEXT816(0x1000003d10);
            uVar158 = auVar2._0_8_;
            auVar145._8_8_ = 0;
            auVar145._0_8_ = uVar158 >> 0x34 | auVar2._8_8_ << 0xc;
            auVar54._8_8_ = 0;
            auVar54._0_8_ = local_100.n[0];
            auVar114._8_8_ = 0;
            auVar114._0_8_ = uVar152;
            auVar55._8_8_ = 0;
            auVar55._0_8_ = local_100.n[1];
            auVar115._8_8_ = 0;
            auVar115._0_8_ = uVar159;
            auVar56._8_8_ = 0;
            auVar56._0_8_ = local_100.n[2];
            auVar116._8_8_ = 0;
            auVar116._0_8_ = uVar154;
            auVar57._8_8_ = 0;
            auVar57._0_8_ = local_100.n[3];
            auVar117._8_8_ = 0;
            auVar117._0_8_ = uVar155;
            auVar58._8_8_ = 0;
            auVar58._0_8_ = local_100.n[4];
            auVar118._8_8_ = 0;
            auVar118._0_8_ = uVar153;
            auVar2 = auVar55 * auVar115 + auVar145 + auVar56 * auVar116 + auVar57 * auVar117 +
                     auVar58 * auVar118;
            uVar156 = auVar2._0_8_;
            auVar147._8_8_ = 0;
            auVar147._0_8_ = uVar156 >> 0x34 | auVar2._8_8_ << 0xc;
            auVar119._8_8_ = 0;
            auVar119._0_8_ = (uVar156 & 0xfffffffffffff) << 4 | (uVar158 & 0xfffffffffffff) >> 0x30;
            auVar2 = auVar54 * auVar114 + ZEXT816(0x1000003d1) * auVar119;
            uVar160 = auVar2._0_8_;
            uVar156 = uVar160 & 0xfffffffffffff;
            auVar146._8_8_ = 0;
            auVar146._0_8_ = uVar160 >> 0x34 | auVar2._8_8_ << 0xc;
            auVar59._8_8_ = 0;
            auVar59._0_8_ = local_100.n[0];
            auVar120._8_8_ = 0;
            auVar120._0_8_ = uVar153;
            auVar60._8_8_ = 0;
            auVar60._0_8_ = local_100.n[1];
            auVar121._8_8_ = 0;
            auVar121._0_8_ = uVar152;
            auVar61._8_8_ = 0;
            auVar61._0_8_ = local_100.n[2];
            auVar122._8_8_ = 0;
            auVar122._0_8_ = uVar159;
            auVar62._8_8_ = 0;
            auVar62._0_8_ = local_100.n[3];
            auVar123._8_8_ = 0;
            auVar123._0_8_ = uVar154;
            auVar63._8_8_ = 0;
            auVar63._0_8_ = local_100.n[4];
            auVar124._8_8_ = 0;
            auVar124._0_8_ = uVar155;
            auVar3 = auVar61 * auVar122 + auVar147 + auVar62 * auVar123 + auVar63 * auVar124;
            uVar160 = auVar3._0_8_;
            auVar64._8_8_ = 0;
            auVar64._0_8_ = uVar160 & 0xfffffffffffff;
            auVar2 = auVar59 * auVar120 + auVar146 + auVar60 * auVar121 +
                     auVar64 * ZEXT816(0x1000003d10);
            uVar161 = auVar2._0_8_;
            auVar149._8_8_ = 0;
            auVar149._0_8_ = uVar160 >> 0x34 | auVar3._8_8_ << 0xc;
            local_78 = uVar161 & 0xfffffffffffff;
            auVar148._8_8_ = 0;
            auVar148._0_8_ = uVar161 >> 0x34 | auVar2._8_8_ << 0xc;
            auVar65._8_8_ = 0;
            auVar65._0_8_ = local_100.n[0];
            auVar125._8_8_ = 0;
            auVar125._0_8_ = uVar155;
            auVar66._8_8_ = 0;
            auVar66._0_8_ = local_100.n[1];
            auVar126._8_8_ = 0;
            auVar126._0_8_ = uVar153;
            auVar67._8_8_ = 0;
            auVar67._0_8_ = local_100.n[2];
            auVar127._8_8_ = 0;
            auVar127._0_8_ = uVar152;
            auVar68._8_8_ = 0;
            auVar68._0_8_ = local_100.n[3];
            auVar128._8_8_ = 0;
            auVar128._0_8_ = uVar159;
            auVar69._8_8_ = 0;
            auVar69._0_8_ = local_100.n[4];
            auVar129._8_8_ = 0;
            auVar129._0_8_ = uVar154;
            auVar3 = auVar68 * auVar128 + auVar149 + auVar69 * auVar129;
            uVar155 = auVar3._0_8_;
            auVar70._8_8_ = 0;
            auVar70._0_8_ = uVar155 & 0xfffffffffffff;
            auVar2 = auVar65 * auVar125 + auVar148 + auVar66 * auVar126 + auVar67 * auVar127 +
                     auVar70 * ZEXT816(0x1000003d10);
            uVar152 = auVar2._0_8_;
            uStack_70 = uVar152 & 0xfffffffffffff;
            auVar150._8_8_ = 0;
            auVar150._0_8_ = (uVar152 >> 0x34 | auVar2._8_8_ << 0xc) + (uVar157 & 0xfffffffffffff);
            auVar71._8_8_ = 0;
            auVar71._0_8_ = uVar155 >> 0x34 | auVar3._8_8_ << 0xc;
            auVar150 = auVar71 * ZEXT816(0x1000003d10) + auVar150;
            uVar155 = auVar150._0_8_;
            local_68 = uVar155 & 0xfffffffffffff;
            lStack_60 = (uVar155 >> 0x34 | auVar150._8_8_ << 0xc) + (uVar158 & 0xffffffffffff);
            local_80 = uVar156 + 7;
            local_150.n[0] = (uVar156 - local_58) + 0x3ffffbfffff0c3;
            local_150.n[1] = (local_78 - local_50) + 0x3ffffffffffffc;
            local_150.n[2] = (uStack_70 - uStack_48) + 0x3ffffffffffffc;
            local_150.n[3] = (local_68 - local_40) + 0x3ffffffffffffc;
            local_150.n[4] = (lStack_60 - lStack_38) + 0x3fffffffffffc;
            iVar151 = secp256k1_fe_impl_normalizes_to_zero_var(&local_150);
          }
        }
      }
      else if (((inputlen == 0x21) && (bVar1 = *input, (bVar1 & 0xfe) == 2)) &&
              ((secp256k1_fe_impl_set_b32_mod(&local_150,input + 1),
               local_150.n[0] < 0xffffefffffc2f ||
               ((local_150.n[4] != 0xffffffffffff ||
                (iVar151 = 0, (local_150.n[2] & local_150.n[3] & local_150.n[1]) != 0xfffffffffffff)
                ))))) {
        iVar151 = secp256k1_ge_set_xo_var(&local_d8,&local_150,(uint)(bVar1 == 3));
      }
      if (iVar151 != 0) {
        secp256k1_pubkey_save(pubkey,&local_d8);
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int secp256k1_ec_pubkey_parse(const secp256k1_context* ctx, secp256k1_pubkey* pubkey, const unsigned char *input, size_t inputlen) {
    secp256k1_ge Q;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    memset(pubkey, 0, sizeof(*pubkey));
    ARG_CHECK(input != NULL);
    if (!secp256k1_eckey_pubkey_parse(&Q, input, inputlen)) {
        return 0;
    }
    if (!secp256k1_ge_is_in_correct_subgroup(&Q)) {
        return 0;
    }
    secp256k1_pubkey_save(pubkey, &Q);
    secp256k1_ge_clear(&Q);
    return 1;
}